

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

Option * ncnn::get_masked_option(Option *__return_storage_ptr__,Option *opt,int featmask)

{
  ulong uVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  Allocator *pAVar10;
  Allocator *pAVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  int iVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  int iVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  int iVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  bool bVar42;
  bool bVar43;
  bool bVar44;
  bool bVar45;
  int iVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  
  bVar42 = opt->lightmode;
  bVar43 = opt->use_shader_pack8;
  bVar44 = opt->use_subgroup_ops;
  bVar45 = opt->use_reserved_0;
  iVar46 = opt->num_threads;
  pAVar10 = opt->blob_allocator;
  pAVar11 = opt->workspace_allocator;
  iVar24 = opt->openmp_blocktime;
  bVar25 = opt->use_winograd_convolution;
  bVar26 = opt->use_sgemm_convolution;
  bVar27 = opt->use_int8_inference;
  bVar28 = opt->use_vulkan_compute;
  bVar12 = opt->use_fp16_packed;
  bVar13 = opt->use_fp16_storage;
  bVar14 = opt->use_fp16_arithmetic;
  bVar15 = opt->use_int8_packed;
  bVar16 = opt->use_int8_storage;
  bVar17 = opt->use_int8_arithmetic;
  bVar18 = opt->use_packing_layout;
  iVar19 = opt->vulkan_device_index;
  bVar20 = opt->use_reserved_1;
  bVar21 = opt->use_image_storage;
  bVar22 = opt->use_tensor_storage;
  bVar23 = opt->use_reserved_2;
  iVar29 = opt->flush_denormals;
  bVar30 = opt->use_local_pool_allocator;
  bVar31 = opt->use_shader_local_memory;
  bVar32 = opt->use_cooperative_matrix;
  bVar33 = opt->use_winograd23_convolution;
  bVar34 = opt->use_winograd43_convolution;
  bVar35 = opt->use_winograd63_convolution;
  bVar36 = opt->use_a53_a55_optimized_kernel;
  bVar37 = opt->use_fp16_uniform;
  bVar38 = opt->use_int8_uniform;
  bVar39 = opt->use_reserved_9;
  bVar40 = opt->use_reserved_10;
  bVar41 = opt->use_reserved_11;
  __return_storage_ptr__->use_bf16_storage = opt->use_bf16_storage;
  __return_storage_ptr__->use_fp16_packed = bVar12;
  __return_storage_ptr__->use_fp16_storage = bVar13;
  __return_storage_ptr__->use_fp16_arithmetic = bVar14;
  __return_storage_ptr__->use_int8_packed = bVar15;
  __return_storage_ptr__->use_int8_storage = bVar16;
  __return_storage_ptr__->use_int8_arithmetic = bVar17;
  __return_storage_ptr__->use_packing_layout = bVar18;
  __return_storage_ptr__->vulkan_device_index = iVar19;
  __return_storage_ptr__->use_reserved_1 = bVar20;
  __return_storage_ptr__->use_image_storage = bVar21;
  __return_storage_ptr__->use_tensor_storage = bVar22;
  __return_storage_ptr__->use_reserved_2 = bVar23;
  __return_storage_ptr__->workspace_allocator = pAVar11;
  __return_storage_ptr__->openmp_blocktime = iVar24;
  __return_storage_ptr__->use_winograd_convolution = bVar25;
  __return_storage_ptr__->use_sgemm_convolution = bVar26;
  __return_storage_ptr__->use_int8_inference = bVar27;
  __return_storage_ptr__->use_vulkan_compute = bVar28;
  __return_storage_ptr__->flush_denormals = iVar29;
  __return_storage_ptr__->use_local_pool_allocator = bVar30;
  __return_storage_ptr__->use_shader_local_memory = bVar31;
  __return_storage_ptr__->use_cooperative_matrix = bVar32;
  __return_storage_ptr__->use_winograd23_convolution = bVar33;
  __return_storage_ptr__->use_winograd43_convolution = bVar34;
  __return_storage_ptr__->use_winograd63_convolution = bVar35;
  __return_storage_ptr__->use_a53_a55_optimized_kernel = bVar36;
  __return_storage_ptr__->use_fp16_uniform = bVar37;
  __return_storage_ptr__->use_int8_uniform = bVar38;
  __return_storage_ptr__->use_reserved_9 = bVar39;
  __return_storage_ptr__->use_reserved_10 = bVar40;
  __return_storage_ptr__->use_reserved_11 = bVar41;
  __return_storage_ptr__->lightmode = bVar42;
  __return_storage_ptr__->use_shader_pack8 = bVar43;
  __return_storage_ptr__->use_subgroup_ops = bVar44;
  __return_storage_ptr__->use_reserved_0 = bVar45;
  __return_storage_ptr__->num_threads = iVar46;
  __return_storage_ptr__->blob_allocator = pAVar10;
  auVar47._0_4_ = -(uint)((featmask & 0x10U) == 0);
  auVar47._4_4_ = -(uint)((featmask & 4U) == 0);
  auVar47._8_4_ = 0xffffffff;
  auVar47._12_4_ = 0xffffffff;
  uVar1._0_1_ = __return_storage_ptr__->use_vulkan_compute;
  uVar1._1_1_ = __return_storage_ptr__->use_bf16_storage;
  uVar1._2_1_ = __return_storage_ptr__->use_fp16_packed;
  uVar1._3_1_ = __return_storage_ptr__->use_fp16_storage;
  uVar1._4_1_ = __return_storage_ptr__->use_fp16_arithmetic;
  uVar1._5_1_ = __return_storage_ptr__->use_int8_packed;
  uVar1._6_1_ = __return_storage_ptr__->use_int8_storage;
  uVar1._7_1_ = __return_storage_ptr__->use_int8_arithmetic;
  auVar56._8_6_ = 0;
  auVar56._0_8_ = uVar1;
  auVar56[0xe] = uVar1._7_1_;
  auVar56[0xf] = uVar1._7_1_;
  auVar55._14_2_ = auVar56._14_2_;
  auVar55._8_5_ = 0;
  auVar55._0_8_ = uVar1;
  auVar55[0xd] = uVar1._6_1_;
  auVar54._13_3_ = auVar55._13_3_;
  auVar54._8_4_ = 0;
  auVar54._0_8_ = uVar1;
  auVar54[0xc] = uVar1._6_1_;
  auVar53._12_4_ = auVar54._12_4_;
  auVar53._8_3_ = 0;
  auVar53._0_8_ = uVar1;
  auVar53[0xb] = uVar1._5_1_;
  auVar52._11_5_ = auVar53._11_5_;
  auVar52._8_2_ = 0;
  auVar52._0_8_ = uVar1;
  auVar52[10] = uVar1._5_1_;
  auVar51._10_6_ = auVar52._10_6_;
  auVar51[8] = 0;
  auVar51._0_8_ = uVar1;
  auVar51[9] = uVar1._4_1_;
  auVar50._9_7_ = auVar51._9_7_;
  auVar50[8] = uVar1._4_1_;
  auVar50._0_8_ = uVar1;
  auVar49._8_8_ = auVar50._8_8_;
  auVar49[7] = uVar1._3_1_;
  auVar49[6] = uVar1._3_1_;
  auVar49[5] = uVar1._2_1_;
  auVar49[4] = uVar1._2_1_;
  auVar49[3] = uVar1._1_1_;
  auVar49[2] = uVar1._1_1_;
  auVar49[1] = (undefined1)uVar1;
  auVar49[0] = (undefined1)uVar1;
  auVar57 = pshuflw(in_XMM4,auVar47,0xe8);
  auVar58._8_8_ = auVar57._8_8_;
  auVar58._0_8_ = auVar57._0_8_ & 0xffff0000ffffffff | (ulong)((featmask & 2U) == 0) << 0x20;
  auVar57._0_4_ = -(uint)((featmask & 1U) == 0);
  auVar57._4_4_ = -(uint)((featmask & 8U) == 0);
  auVar57._8_4_ = -(uint)((featmask & 8U) == 0);
  auVar57._12_4_ = -(uint)((featmask & 8U) == 0);
  auVar57 = pshuflw(auVar57,auVar57,0xa8);
  auVar48 = pshuflw((undefined1  [16])0x0,auVar58,0xa4);
  auVar48._8_8_ = auVar57._0_8_;
  auVar57 = auVar48 & auVar49 & _DAT_005ef630;
  sVar2 = auVar57._0_2_;
  sVar3 = auVar57._2_2_;
  sVar4 = auVar57._4_2_;
  sVar5 = auVar57._6_2_;
  sVar6 = auVar57._8_2_;
  sVar7 = auVar57._10_2_;
  sVar8 = auVar57._12_2_;
  sVar9 = auVar57._14_2_;
  __return_storage_ptr__->use_vulkan_compute =
       (bool)((0 < sVar2) * (sVar2 < 0x100) * auVar57[0] - (0xff < sVar2));
  __return_storage_ptr__->use_bf16_storage =
       (bool)((0 < sVar3) * (sVar3 < 0x100) * auVar57[2] - (0xff < sVar3));
  __return_storage_ptr__->use_fp16_packed =
       (bool)((0 < sVar4) * (sVar4 < 0x100) * auVar57[4] - (0xff < sVar4));
  __return_storage_ptr__->use_fp16_storage =
       (bool)((0 < sVar5) * (sVar5 < 0x100) * auVar57[6] - (0xff < sVar5));
  __return_storage_ptr__->use_fp16_arithmetic =
       (bool)((0 < sVar6) * (sVar6 < 0x100) * auVar57[8] - (0xff < sVar6));
  __return_storage_ptr__->use_int8_packed =
       (bool)((0 < sVar7) * (sVar7 < 0x100) * auVar57[10] - (0xff < sVar7));
  __return_storage_ptr__->use_int8_storage =
       (bool)((0 < sVar8) * (sVar8 < 0x100) * auVar57[0xc] - (0xff < sVar8));
  __return_storage_ptr__->use_int8_arithmetic =
       (bool)((0 < sVar9) * (sVar9 < 0x100) * auVar57[0xe] - (0xff < sVar9));
  __return_storage_ptr__->use_image_storage =
       (bool)(__return_storage_ptr__->use_image_storage & (byte)auVar47._0_4_);
  __return_storage_ptr__->use_tensor_storage =
       (bool)(__return_storage_ptr__->use_tensor_storage & (byte)auVar47._0_4_);
  __return_storage_ptr__->use_sgemm_convolution =
       (bool)(__return_storage_ptr__->use_sgemm_convolution & (featmask & 0x20U) == 0);
  __return_storage_ptr__->use_winograd_convolution =
       (bool)(__return_storage_ptr__->use_winograd_convolution & (featmask & 0x40U) == 0);
  if ((char)featmask < '\0') {
    __return_storage_ptr__->num_threads = 1;
  }
  return __return_storage_ptr__;
}

Assistant:

static Option get_masked_option(const Option& opt, int featmask)
{
    // mask option usage as layer specific featmask
    Option opt1 = opt;
    opt1.use_fp16_arithmetic = opt1.use_fp16_arithmetic && !(featmask & (1 << 0));
    opt1.use_fp16_storage = opt1.use_fp16_storage && !(featmask & (1 << 1));
    opt1.use_fp16_packed = opt1.use_fp16_packed && !(featmask & (1 << 1));
    opt1.use_bf16_storage = opt1.use_bf16_storage && !(featmask & (1 << 2));
    opt1.use_int8_packed = opt1.use_int8_packed && !(featmask & (1 << 3));
    opt1.use_int8_storage = opt1.use_int8_storage && !(featmask & (1 << 3));
    opt1.use_int8_arithmetic = opt1.use_int8_arithmetic && !(featmask & (1 << 3));
    opt1.use_vulkan_compute = opt1.use_vulkan_compute && !(featmask & (1 << 4));
    opt1.use_image_storage = opt1.use_image_storage && !(featmask & (1 << 4));
    opt1.use_tensor_storage = opt1.use_tensor_storage && !(featmask & (1 << 4));
    opt1.use_sgemm_convolution = opt1.use_sgemm_convolution && !(featmask & (1 << 5));
    opt1.use_winograd_convolution = opt1.use_winograd_convolution && !(featmask & (1 << 6));

    if (featmask & (1 << 7))
        opt1.num_threads = 1;

    return opt1;
}